

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

MockSpec<void_*(unsigned_long)> * __thiscall
testing::internal::FunctionMocker<void_*(unsigned_long)>::With
          (FunctionMocker<void_*(unsigned_long)> *this,Matcher<unsigned_long> *m1)

{
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_> local_28;
  
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::linked_ptr
            (&local_28,&(m1->super_MatcherBase<unsigned_long>).impl_);
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::operator=
            ((linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *)
             ((long)&(this->super_FunctionMockerBase<void_*(unsigned_long)>).current_spec_.matchers_
                     .super__Tuple_impl<0UL,_testing::Matcher<unsigned_long>_>.
                     super__Head_base<0UL,_testing::Matcher<unsigned_long>,_false>._M_head_impl.
                     super_MatcherBase<unsigned_long> + 8),&local_28);
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr(&local_28);
  return &(this->super_FunctionMockerBase<void_*(unsigned_long)>).current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }